

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<float,1,0>::accumulateDerivativesImpl<true,false,true>
          (BeagleCPUImpl<float,1,0> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 in_ZMM2 [64];
  float derivative;
  int k;
  float sumSquared;
  float sum;
  double *outSumSquaredDerivatives_local;
  double *outSumDerivatives_local;
  double *outDerivatives_local;
  BeagleCPUImpl<float,_1,_0> *this_local;
  
  sumSquared = 0.0;
  for (k = 0; k < *(int *)(this + 0x14); k = k + 1) {
    fVar1 = *(float *)(*(long *)(this + 0xf8) + (long)k * 4) /
            *(float *)(*(long *)(this + 0xf0) + (long)k * 4);
    outDerivatives[k] = (double)fVar1;
    auVar2._0_8_ = (double)(fVar1 * fVar1);
    auVar2._8_8_ = 0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(ulong *)(*(long *)(this + 0x78) + (long)k * 8);
    auVar4._0_8_ = (double)sumSquared;
    auVar4._8_8_ = in_ZMM2._8_8_;
    in_ZMM2 = ZEXT1664(auVar4);
    auVar2 = vfmadd213sd_fma(auVar3,auVar2,auVar4);
    sumSquared = (float)auVar2._0_8_;
  }
  *outSumSquaredDerivatives = (double)sumSquared;
  return;
}

Assistant:

void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivativesImpl(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    REALTYPE sum = 0.0;
    REALTYPE sumSquared = 0.0;

    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE derivative = grandNumeratorDerivTmp[k] / grandDenominatorDerivTmp[k];
        if (DoDerivatives) {
            outDerivatives[k] = derivative;
        }
        if (DoSum) { // TODO Confirm that these are compile-time
            sum += derivative * gPatternWeights[k];
        }
        if (DoSumSquared) {
            sumSquared += derivative * derivative * gPatternWeights[k];
        }
    }

    if (DoSum) {
        *outSumDerivatives = sum;
    }

    if (DoSumSquared) {
        *outSumSquaredDerivatives = sumSquared;
    }
}